

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::create<>(Lexer *this,TokenKind kind)

{
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  Token *extraout_RDX;
  undefined2 in_SI;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *in_RDI;
  string_view sVar2;
  SourceLocation location;
  Lexer *in_stack_ffffffffffffff70;
  span<slang::parsing::Trivia,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  Token *this_00;
  SourceLocation in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8 [12];
  undefined4 uVar3;
  undefined6 in_stack_ffffffffffffffe0;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *psVar4;
  Token local_10;
  BumpAllocator *alloc;
  
  uVar3 = *(undefined4 *)&in_RDI[5]._M_ptr;
  psVar4 = in_RDI;
  SourceLocation::SourceLocation
            ((SourceLocation *)in_stack_ffffffffffffff78,(BufferID)(uint32_t)((ulong)in_RDI >> 0x20)
             ,(uint64_t)in_stack_ffffffffffffff70);
  iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy
                    ((SmallVectorBase<slang::parsing::Trivia> *)(in_RDI + 8),
                     (EVP_PKEY_CTX *)in_RDI->_M_ptr,src);
  alloc = (BumpAllocator *)CONCAT44(extraout_var,iVar1);
  this_00 = extraout_RDX;
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
  span<slang::parsing::Trivia,_18446744073709551615UL>(in_RDI,in_stack_ffffffffffffff78);
  sVar2 = lexeme(in_stack_ffffffffffffff70);
  trivia._M_extent._M_extent_value._4_4_ = uVar3;
  trivia._0_12_ = in_stack_ffffffffffffffc8;
  rawText._M_len._6_2_ = in_SI;
  rawText._M_len._0_6_ = in_stack_ffffffffffffffe0;
  rawText._M_str = (char *)psVar4;
  Token::Token(this_00,alloc,sVar2._M_str._6_2_,trivia,rawText,in_stack_ffffffffffffffc0);
  return local_10;
}

Assistant:

Token Lexer::create(TokenKind kind, Args&&... args) {
    SourceLocation location(bufferId, size_t(marker - originalBegin));
    return Token(alloc, kind, triviaBuffer.copy(alloc), lexeme(), location,
                 std::forward<Args>(args)...);
}